

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall
wasm_importtype_t::wasm_importtype_t(wasm_importtype_t *this,wasm_importtype_t *other)

{
  ImportType local_60;
  wasm_importtype_t *local_18;
  wasm_importtype_t *other_local;
  wasm_importtype_t *this_local;
  
  local_18 = other;
  other_local = this;
  wabt::interp::ImportType::ImportType(&local_60,&other->I);
  wasm_importtype_t(this,&local_60);
  wabt::interp::ImportType::~ImportType(&local_60);
  return;
}

Assistant:

wasm_importtype_t(const wasm_importtype_t& other)
      : wasm_importtype_t(other.I) {}